

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_struct_swap(t_cpp_generator *this,ostream *out,t_struct *tstruct)

{
  t_struct *ptVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  e_req eVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ostream *poVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  members_type *this_00;
  reference pptVar7;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  string *psVar8;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  size_type sVar9;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  t_field *local_c0;
  t_field *tfield;
  const_iterator __end1;
  const_iterator __begin1;
  vector<t_field_*,_std::allocator<t_field_*>_> *__range1;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  undefined1 local_90 [7];
  bool has_nonrequired_fields;
  string local_70;
  string local_40;
  t_struct *local_20;
  t_struct *tstruct_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  local_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(extraout_var,iVar4),"a");
  if (bVar2) {
LAB_00206a41:
    ptVar1 = tstruct_local;
    t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)ptVar1,(string *)&local_40);
    poVar6 = std::operator<<(poVar6,"void swap(");
    iVar4 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_01,iVar4));
    poVar6 = std::operator<<(poVar6," &a1, ");
    iVar4 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_02,iVar4));
    poVar6 = std::operator<<(poVar6," &a2) {");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    iVar4 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(extraout_var_00,iVar4),"b");
    ptVar1 = tstruct_local;
    if (bVar2) goto LAB_00206a41;
    t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)ptVar1,(string *)&local_70);
    poVar6 = std::operator<<(poVar6,"void swap(");
    iVar4 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_03,iVar4));
    poVar6 = std::operator<<(poVar6," &a, ");
    iVar4 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_04,iVar4));
    poVar6 = std::operator<<(poVar6," &b) {");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_70);
  }
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_((string *)local_90,(t_generator *)this);
  poVar6 = std::operator<<((ostream *)ptVar1,(string *)local_90);
  poVar6 = std::operator<<(poVar6,"using ::std::swap;");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_90);
  bVar2 = false;
  this_00 = t_struct::get_members(local_20);
  __end1 = std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
  tfield = (t_field *)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                     *)&tfield), bVar3) {
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&__end1);
    local_c0 = *pptVar7;
    eVar5 = t_field::get_req(local_c0);
    if (eVar5 != T_REQUIRED) {
      bVar2 = true;
    }
    iVar4 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(extraout_var_05,iVar4),"a");
    if (bVar3) {
LAB_00206e21:
      ptVar1 = tstruct_local;
      t_generator::indent_abi_cxx11_(&local_e0,(t_generator *)this);
      poVar6 = std::operator<<((ostream *)ptVar1,(string *)&local_e0);
      poVar6 = std::operator<<(poVar6,"swap(a1.");
      psVar8 = t_field::get_name_abi_cxx11_(local_c0);
      poVar6 = std::operator<<(poVar6,(string *)psVar8);
      poVar6 = std::operator<<(poVar6,", a2.");
      psVar8 = t_field::get_name_abi_cxx11_(local_c0);
      poVar6 = std::operator<<(poVar6,(string *)psVar8);
      poVar6 = std::operator<<(poVar6,");");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    else {
      iVar4 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(extraout_var_06,iVar4),"b");
      ptVar1 = tstruct_local;
      if (bVar3) goto LAB_00206e21;
      t_generator::indent_abi_cxx11_(&local_100,(t_generator *)this);
      poVar6 = std::operator<<((ostream *)ptVar1,(string *)&local_100);
      poVar6 = std::operator<<(poVar6,"swap(a.");
      psVar8 = t_field::get_name_abi_cxx11_(local_c0);
      poVar6 = std::operator<<(poVar6,(string *)psVar8);
      poVar6 = std::operator<<(poVar6,", b.");
      psVar8 = t_field::get_name_abi_cxx11_(local_c0);
      poVar6 = std::operator<<(poVar6,(string *)psVar8);
      poVar6 = std::operator<<(poVar6,");");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_100);
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&__end1);
  }
  if (bVar2) {
    iVar4 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(extraout_var_07,iVar4),"a");
    if (!bVar2) {
      iVar4 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(extraout_var_08,iVar4),"b");
      ptVar1 = tstruct_local;
      if (!bVar2) {
        t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
        poVar6 = std::operator<<((ostream *)ptVar1,(string *)&local_140);
        poVar6 = std::operator<<(poVar6,"swap(a.__isset, b.__isset);");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_140);
        goto LAB_00207230;
      }
    }
    ptVar1 = tstruct_local;
    t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)ptVar1,(string *)&local_120);
    poVar6 = std::operator<<(poVar6,"swap(a1.__isset, a2.__isset);");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_120);
  }
LAB_00207230:
  sVar9 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size(this_00);
  if (sVar9 == 0) {
    iVar4 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(extraout_var_09,iVar4),"a");
    if (!bVar2) {
      iVar4 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(extraout_var_10,iVar4),"b");
      ptVar1 = tstruct_local;
      if (!bVar2) {
        t_generator::indent_abi_cxx11_(&local_1a0,(t_generator *)this);
        poVar6 = std::operator<<((ostream *)ptVar1,(string *)&local_1a0);
        poVar6 = std::operator<<(poVar6,"(void) a;");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1a0);
        ptVar1 = tstruct_local;
        t_generator::indent_abi_cxx11_(&local_1c0,(t_generator *)this);
        poVar6 = std::operator<<((ostream *)ptVar1,(string *)&local_1c0);
        poVar6 = std::operator<<(poVar6,"(void) b;");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1c0);
        goto LAB_002074f4;
      }
    }
    ptVar1 = tstruct_local;
    t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)ptVar1,(string *)&local_160);
    poVar6 = std::operator<<(poVar6,"(void) a1;");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_160);
    ptVar1 = tstruct_local;
    t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)ptVar1,(string *)&local_180);
    poVar6 = std::operator<<(poVar6,"(void) a2;");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_180);
  }
LAB_002074f4:
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)tstruct_local);
  std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_cpp_generator::generate_struct_swap(ostream& out, t_struct* tstruct) {
  if (tstruct->get_name() == "a" || tstruct->get_name() == "b") {
    out << indent() << "void swap(" << tstruct->get_name() << " &a1, " << tstruct->get_name()
        << " &a2) {" << endl; 
  } else {
    out << indent() << "void swap(" << tstruct->get_name() << " &a, " << tstruct->get_name()
        << " &b) {" << endl;
  }

  indent_up();

  // Let argument-dependent name lookup find the correct swap() function to
  // use based on the argument types.  If none is found in the arguments'
  // namespaces, fall back to ::std::swap().
  out << indent() << "using ::std::swap;" << endl;

  bool has_nonrequired_fields = false;
  const vector<t_field*>& fields = tstruct->get_members();
  for (auto tfield : fields) {
    if (tfield->get_req() != t_field::T_REQUIRED) {
      has_nonrequired_fields = true;
    }

    if (tstruct->get_name() == "a" || tstruct->get_name() == "b") {
      out << indent() << "swap(a1." << tfield->get_name() << ", a2." << tfield->get_name() << ");"
          << endl;
    } else {
      out << indent() << "swap(a." << tfield->get_name() << ", b." << tfield->get_name() << ");"
          << endl;
    }
  }

  if (has_nonrequired_fields) {
    if (tstruct->get_name() == "a" || tstruct->get_name() == "b") {
      out << indent() << "swap(a1.__isset, a2.__isset);" << endl; 
    } else {
      out << indent() << "swap(a.__isset, b.__isset);" << endl;
    }
  }

  // handle empty structs
  if (fields.size() == 0) {
    if (tstruct->get_name() == "a" || tstruct->get_name() == "b") {
      out << indent() << "(void) a1;" << endl;
      out << indent() << "(void) a2;" << endl;
    } else {
      out << indent() << "(void) a;" << endl;
      out << indent() << "(void) b;" << endl;
    }
  }

  scope_down(out);
  out << endl;
}